

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cComputeShaderTests.cpp
# Opt level: O0

long __thiscall
glcts::anon_unknown_0::NegativeGLSLCompileTimeErrors::Run(NegativeGLSLCompileTimeErrors *this)

{
  bool bVar1;
  CallLogWrapper *this_00;
  int in_R8D;
  string local_130;
  string local_110;
  string local_f0;
  int local_d0;
  int local_cc;
  GLint z;
  GLint y;
  GLint x;
  allocator<char> local_99;
  string local_98;
  allocator<char> local_71;
  string local_70;
  allocator<char> local_39;
  string local_38;
  NegativeGLSLCompileTimeErrors *local_18;
  NegativeGLSLCompileTimeErrors *this_local;
  
  local_18 = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,
             "#version 300 es\nlayout(local_size_x = 1) in;\nlayout(std430) buffer Output {\n  uint g_output[];\n};\nvoid main() {\n  g_output[gl_GlobalInvocationID.x] = 0;\n}"
             ,&local_39);
  bVar1 = Compile(this,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator(&local_39);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_70,
               "#version 310 es\nlayout(local_size_x = 1) in;\nlayout(local_size_x = 2) in;\nlayout(std430) buffer Output {\n  uint g_output[];\n};\nvoid main() {\n  g_output[gl_GlobalInvocationID.x] = 0;\n}"
               ,&local_71);
    bVar1 = Compile(this,&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    std::allocator<char>::~allocator(&local_71);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_98,
                 "#version 310 es\nlayout(local_size_x = 1) in;\nin uint x;\nlayout(std430) buffer Output {\n  uint g_output[];\n};\nvoid main() {\n  g_output[gl_GlobalInvocationID.x] = x;\n}"
                 ,&local_99);
      bVar1 = Compile(this,&local_98);
      std::__cxx11::string::~string((string *)&local_98);
      std::allocator<char>::~allocator(&local_99);
      if (((bVar1 ^ 0xffU) & 1) == 0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&x,
                   "#version 310 es\nlayout(local_size_x = 1) in;\nout uint x;\nlayout(std430) buffer Output {\n  uint g_output[];\n};\nvoid main() {\n  g_output[gl_GlobalInvocationID.x] = 0;\n  x = 0;\n}"
                   ,(allocator<char> *)((long)&y + 3));
        bVar1 = Compile(this,(string *)&x);
        std::__cxx11::string::~string((string *)&x);
        std::allocator<char>::~allocator((allocator<char> *)((long)&y + 3));
        if (((bVar1 ^ 0xffU) & 1) == 0) {
          this_00 = &(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                     super_CallLogWrapper;
          glu::CallLogWrapper::glGetIntegeri_v(this_00,0x91bf,0,&z);
          glu::CallLogWrapper::glGetIntegeri_v(this_00,0x91bf,0,&local_cc);
          glu::CallLogWrapper::glGetIntegeri_v(this_00,0x91bf,0,&local_d0);
          glcts::(anonymous_namespace)::NegativeGLSLCompileTimeErrors::Shader1_abi_cxx11_
                    (&local_f0,(NegativeGLSLCompileTimeErrors *)(ulong)(z + 1),1,1,in_R8D);
          bVar1 = Compile(this,&local_f0);
          std::__cxx11::string::~string((string *)&local_f0);
          if (((bVar1 ^ 0xffU) & 1) == 0) {
            glcts::(anonymous_namespace)::NegativeGLSLCompileTimeErrors::Shader1_abi_cxx11_
                      (&local_110,(NegativeGLSLCompileTimeErrors *)&DAT_00000001,local_cc + 1,1,
                       in_R8D);
            bVar1 = Compile(this,&local_110);
            std::__cxx11::string::~string((string *)&local_110);
            if (((bVar1 ^ 0xffU) & 1) == 0) {
              glcts::(anonymous_namespace)::NegativeGLSLCompileTimeErrors::Shader1_abi_cxx11_
                        (&local_130,(NegativeGLSLCompileTimeErrors *)&DAT_00000001,1,local_d0 + 1,
                         in_R8D);
              bVar1 = Compile(this,&local_130);
              std::__cxx11::string::~string((string *)&local_130);
              if (((bVar1 ^ 0xffU) & 1) == 0) {
                this_local = (NegativeGLSLCompileTimeErrors *)0x0;
              }
              else {
                this_local = (NegativeGLSLCompileTimeErrors *)&DAT_ffffffffffffffff;
              }
            }
            else {
              this_local = (NegativeGLSLCompileTimeErrors *)&DAT_ffffffffffffffff;
            }
          }
          else {
            this_local = (NegativeGLSLCompileTimeErrors *)&DAT_ffffffffffffffff;
          }
        }
        else {
          this_local = (NegativeGLSLCompileTimeErrors *)&DAT_ffffffffffffffff;
        }
      }
      else {
        this_local = (NegativeGLSLCompileTimeErrors *)&DAT_ffffffffffffffff;
      }
    }
    else {
      this_local = (NegativeGLSLCompileTimeErrors *)&DAT_ffffffffffffffff;
    }
  }
  else {
    this_local = (NegativeGLSLCompileTimeErrors *)&DAT_ffffffffffffffff;
  }
  return (long)this_local;
}

Assistant:

virtual long Run()
	{
		// gl_GlobalInvocationID requires "#version 310" or later
		if (!Compile("#version 300 es" NL "layout(local_size_x = 1) in;" NL "layout(std430) buffer Output {" NL
					 "  uint g_output[];" NL "};" NL "void main() {" NL "  g_output[gl_GlobalInvocationID.x] = 0;" NL
					 "}"))
			return ERROR;

		if (!Compile("#version 310 es" NL "layout(local_size_x = 1) in;" NL "layout(local_size_x = 2) in;" NL
					 "layout(std430) buffer Output {" NL "  uint g_output[];" NL "};" NL "void main() {" NL
					 "  g_output[gl_GlobalInvocationID.x] = 0;" NL "}"))
			return ERROR;

		if (!Compile("#version 310 es" NL "layout(local_size_x = 1) in;" NL "in uint x;" NL
					 "layout(std430) buffer Output {" NL "  uint g_output[];" NL "};" NL "void main() {" NL
					 "  g_output[gl_GlobalInvocationID.x] = x;" NL "}"))
			return ERROR;

		if (!Compile("#version 310 es" NL "layout(local_size_x = 1) in;" NL "out uint x;" NL
					 "layout(std430) buffer Output {" NL "  uint g_output[];" NL "};" NL "void main() {" NL
					 "  g_output[gl_GlobalInvocationID.x] = 0;" NL "  x = 0;" NL "}"))
			return ERROR;

		{
			GLint x, y, z;
			glGetIntegeri_v(GL_MAX_COMPUTE_WORK_GROUP_SIZE, 0, &x);
			glGetIntegeri_v(GL_MAX_COMPUTE_WORK_GROUP_SIZE, 0, &y);
			glGetIntegeri_v(GL_MAX_COMPUTE_WORK_GROUP_SIZE, 0, &z);

			if (!Compile(Shader1(x + 1, 1, 1)))
				return ERROR;
			if (!Compile(Shader1(1, y + 1, 1)))
				return ERROR;
			if (!Compile(Shader1(1, 1, z + 1)))
				return ERROR;
		}

		return NO_ERROR;
	}